

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

void bio_write(opj_bio_t *bio,int v,int n)

{
  int iVar1;
  
  for (; 0 < n; n = n + -1) {
    iVar1 = bio->ct;
    if (iVar1 == 0) {
      bio_byteout(bio);
      iVar1 = bio->ct;
    }
    bio->ct = iVar1 + -1;
    bio->buf = bio->buf |
               (uint)(((uint)v >> (n - 1U & 0x1f) & 1) != 0) << ((byte)(iVar1 + -1) & 0x1f);
  }
  return;
}

Assistant:

void bio_write(opj_bio_t *bio, int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		bio_putbit(bio, (v >> i) & 1);
	}
}